

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-load.c
# Opt level: O2

ztresult_t
zt_load(ztstruct_t *meta,void *structure,char *filename,ztregion_t *regions,int nregions,
       ztloader_t **loaders,int nloaders,char **syntax_error)

{
  ztresult_t zVar1;
  ztast_t *ast;
  size_t sVar2;
  char *__dest;
  char errbuf [100];
  
  errbuf[0x50] = '\0';
  errbuf[0x51] = '\0';
  errbuf[0x52] = '\0';
  errbuf[0x53] = '\0';
  errbuf[0x54] = '\0';
  errbuf[0x55] = '\0';
  errbuf[0x56] = '\0';
  errbuf[0x57] = '\0';
  errbuf[0x58] = '\0';
  errbuf[0x59] = '\0';
  errbuf[0x5a] = '\0';
  errbuf[0x5b] = '\0';
  errbuf[0x5c] = '\0';
  errbuf[0x5d] = '\0';
  errbuf[0x5e] = '\0';
  errbuf[0x5f] = '\0';
  errbuf[0x40] = '\0';
  errbuf[0x41] = '\0';
  errbuf[0x42] = '\0';
  errbuf[0x43] = '\0';
  errbuf[0x44] = '\0';
  errbuf[0x45] = '\0';
  errbuf[0x46] = '\0';
  errbuf[0x47] = '\0';
  errbuf[0x48] = '\0';
  errbuf[0x49] = '\0';
  errbuf[0x4a] = '\0';
  errbuf[0x4b] = '\0';
  errbuf[0x4c] = '\0';
  errbuf[0x4d] = '\0';
  errbuf[0x4e] = '\0';
  errbuf[0x4f] = '\0';
  errbuf[0x30] = '\0';
  errbuf[0x31] = '\0';
  errbuf[0x32] = '\0';
  errbuf[0x33] = '\0';
  errbuf[0x34] = '\0';
  errbuf[0x35] = '\0';
  errbuf[0x36] = '\0';
  errbuf[0x37] = '\0';
  errbuf[0x38] = '\0';
  errbuf[0x39] = '\0';
  errbuf[0x3a] = '\0';
  errbuf[0x3b] = '\0';
  errbuf[0x3c] = '\0';
  errbuf[0x3d] = '\0';
  errbuf[0x3e] = '\0';
  errbuf[0x3f] = '\0';
  errbuf[0x20] = '\0';
  errbuf[0x21] = '\0';
  errbuf[0x22] = '\0';
  errbuf[0x23] = '\0';
  errbuf[0x24] = '\0';
  errbuf[0x25] = '\0';
  errbuf[0x26] = '\0';
  errbuf[0x27] = '\0';
  errbuf[0x28] = '\0';
  errbuf[0x29] = '\0';
  errbuf[0x2a] = '\0';
  errbuf[0x2b] = '\0';
  errbuf[0x2c] = '\0';
  errbuf[0x2d] = '\0';
  errbuf[0x2e] = '\0';
  errbuf[0x2f] = '\0';
  errbuf[0x10] = '\0';
  errbuf[0x11] = '\0';
  errbuf[0x12] = '\0';
  errbuf[0x13] = '\0';
  errbuf[0x14] = '\0';
  errbuf[0x15] = '\0';
  errbuf[0x16] = '\0';
  errbuf[0x17] = '\0';
  errbuf[0x18] = '\0';
  errbuf[0x19] = '\0';
  errbuf[0x1a] = '\0';
  errbuf[0x1b] = '\0';
  errbuf[0x1c] = '\0';
  errbuf[0x1d] = '\0';
  errbuf[0x1e] = '\0';
  errbuf[0x1f] = '\0';
  errbuf[0x60] = '\0';
  errbuf[0x61] = '\0';
  errbuf[0x62] = '\0';
  errbuf[99] = '\0';
  errbuf[0] = '\0';
  errbuf[1] = '\0';
  errbuf[2] = '\0';
  errbuf[3] = '\0';
  errbuf[4] = '\0';
  errbuf[5] = '\0';
  errbuf[6] = '\0';
  errbuf[7] = '\0';
  errbuf[8] = '\0';
  errbuf[9] = '\0';
  errbuf[10] = '\0';
  errbuf[0xb] = '\0';
  errbuf[0xc] = '\0';
  errbuf[0xd] = '\0';
  errbuf[0xe] = '\0';
  errbuf[0xf] = '\0';
  *syntax_error = (char *)0x0;
  ast = ztast_from_file(filename,errbuf);
  if (ast == (ztast_t *)0x0) {
    zVar1 = 0x70;
  }
  else {
    zVar1 = zt_run_program(ast,meta,regions,nregions,loaders,nloaders,structure,errbuf);
    ztast_destroy(ast);
  }
  if ((zVar1 != 0) && (errbuf[0] != '\0')) {
    sVar2 = strlen(errbuf);
    __dest = (char *)malloc(sVar2 + 1);
    *syntax_error = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,errbuf,sVar2 + 1);
    }
  }
  return zVar1;
}

Assistant:

ztresult_t zt_load(const ztstruct_t  *meta,
                   void              *structure,
                   const char        *filename,
                   const ztregion_t  *regions,
                   int                nregions,
                   ztloader_t       **loaders,
                   int                nloaders,
                   char             **syntax_error)
{
  ztresult_t rc;
  ztast_t   *ast;
  char       errbuf[ZTMAXERRBUF] = "";

  assert(meta);
  assert(structure);
  assert(filename);
  /* regions may be NULL */
  assert(nregions >= 0);
  assert(syntax_error);

  *syntax_error = NULL;

  ast = ztast_from_file(filename, errbuf);
  if (ast == NULL)
  {
    rc = ztresult_PARSE_FAIL;
    goto exit;
  }

  rc = zt_run_program(ast,
                      meta,
                      regions,
                      nregions,
                      loaders,
                      nloaders,
                      structure,
                      errbuf);

  ztast_destroy(ast);

exit:
  if (rc && errbuf[0])
  {
    size_t len;

    len = strlen(errbuf) + 1;
    *syntax_error = malloc(len);
    if (*syntax_error)
      memcpy(*syntax_error, errbuf, len);
  }

  return rc;
}